

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dioextra.c
# Opt level: O1

bool auto_check_multi(DESCRIPTOR_DATA *d_check,char *host)

{
  bool bVar1;
  DESCRIPTOR_DATA *pDVar2;
  bool bVar3;
  
  bVar3 = descriptor_list != (DESCRIPTOR_DATA *)0x0;
  pDVar2 = descriptor_list;
  if (bVar3) {
    do {
      if (((pDVar2 != d_check) && (pDVar2->character != (CHAR_DATA *)0x0)) &&
         (bVar1 = str_cmp(host,pDVar2->host), !bVar1)) {
        return bVar3;
      }
      bVar3 = pDVar2->next != (DESCRIPTOR_DATA *)0x0;
      pDVar2 = pDVar2->next;
    } while (bVar3);
  }
  return bVar3;
}

Assistant:

bool auto_check_multi(DESCRIPTOR_DATA *d_check, char *host)
{
	for (DESCRIPTOR_DATA *d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d == d_check || d->character == nullptr)
			continue;

		if (!str_cmp(host, d->host))
			return true;
	}

	return false;
}